

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O1

void anon_unknown.dwarf_130114::setClipboardText(void *param_1,char *text)

{
  size_t sVar1;
  char *in_RCX;
  String local_30;
  
  sVar1 = strlen(text);
  sf::String::fromUtf8<char_const*>(&local_30,(String *)text,text + sVar1,in_RCX);
  sf::Clipboard::setString(&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_30.m_string._M_dataplus._M_p != &local_30.m_string.field_2) {
    operator_delete(local_30.m_string._M_dataplus._M_p,
                    local_30.m_string.field_2._M_allocated_capacity * 4 + 4);
  }
  return;
}

Assistant:

void setClipboardText(void* /*userData*/, const char* text) {
    sf::Clipboard::setString(sf::String::fromUtf8(text, text + std::strlen(text)));
}